

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O0

int IDAAdjInit(void *ida_mem,long steps,int interp)

{
  int iVar1;
  IDAadjMemRec *__ptr;
  int in_EDX;
  IDAMem in_RSI;
  IDAMem in_RDI;
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x70,"IDAAdjInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if ((long)in_RSI < 1) {
    IDAProcessError(in_RDI,-0x16,0x7a,"IDAAdjInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                    ,"Steps nonpositive illegal.");
    local_4 = -0x16;
  }
  else if ((in_EDX == 1) || (in_EDX == 2)) {
    __ptr = (IDAadjMemRec *)malloc(0x178);
    if (__ptr == (IDAadjMemRec *)0x0) {
      IDAProcessError(in_RDI,-0x15,0x8c,"IDAAdjInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                      ,"A memory request failed.");
      local_4 = -0x15;
    }
    else {
      in_RDI->ida_adj_mem = __ptr;
      __ptr->ck_mem = (IDAckpntMemRec *)0x0;
      __ptr->ia_nckpnts = 0;
      __ptr->ia_ckpntData = (IDAckpntMemRec *)0x0;
      __ptr->ia_interpType = in_EDX;
      __ptr->ia_nsteps = (long)in_RSI;
      __ptr->ia_ilast = -1;
      iVar1 = IDAAdataMalloc(in_RSI);
      if (iVar1 == 0) {
        free(__ptr);
        IDAProcessError(in_RDI,-0x15,0xa6,"IDAAdjInit",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                        ,"A memory request failed.");
        local_4 = -0x15;
      }
      else {
        if (in_EDX == 1) {
          __ptr->ia_malloc = IDAAhermiteMalloc;
          __ptr->ia_free = IDAAhermiteFree;
          __ptr->ia_getY = IDAAhermiteGetY;
          __ptr->ia_storePnt = IDAAhermiteStorePnt;
        }
        else if (in_EDX == 2) {
          __ptr->ia_malloc = IDAApolynomialMalloc;
          __ptr->ia_free = IDAApolynomialFree;
          __ptr->ia_getY = IDAApolynomialGetY;
          __ptr->ia_storePnt = IDAApolynomialStorePnt;
        }
        __ptr->ia_mallocDone = 0;
        __ptr->ia_storeSensi = 1;
        __ptr->ia_interpSensi = 0;
        __ptr->ia_noInterp = 0;
        __ptr->IDAB_mem = (IDABMemRec *)0x0;
        __ptr->ia_bckpbCrt = (IDABMemRec *)0x0;
        __ptr->ia_nbckpbs = 0;
        __ptr->ia_firstIDAFcall = 1;
        __ptr->ia_tstopIDAFcall = 0;
        __ptr->ia_firstIDABcall = 1;
        __ptr->ia_rootret = 0;
        in_RDI->ida_adj = 1;
        in_RDI->ida_adjMallocDone = 1;
        local_4 = 0;
      }
    }
  }
  else {
    IDAProcessError(in_RDI,-0x16,0x82,"IDAAdjInit",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa.c"
                    ,"Illegal value for interp.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int IDAAdjInit(void* ida_mem, long int steps, int interp)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;

  /* Check arguments */

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  if (steps <= 0)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_STEPS);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  if ((interp != IDA_HERMITE) && (interp != IDA_POLYNOMIAL))
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_BAD_INTERP);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Allocate memory block for IDAadjMem. */
  IDAADJ_mem = (IDAadjMem)malloc(sizeof(struct IDAadjMemRec));
  if (IDAADJ_mem == NULL)
  {
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGAM_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  /* Attach IDAS memory for forward runs */
  IDA_mem->ida_adj_mem = IDAADJ_mem;

  /* Initialization of check points. */
  IDAADJ_mem->ck_mem       = NULL;
  IDAADJ_mem->ia_nckpnts   = 0;
  IDAADJ_mem->ia_ckpntData = NULL;

  /* Initialization of interpolation data. */
  IDAADJ_mem->ia_interpType = interp;
  IDAADJ_mem->ia_nsteps     = steps;

  /* Last index used in IDAAfindIndex, initialize to invalid value */
  IDAADJ_mem->ia_ilast = -1;

  /* Allocate space for the array of Data Point structures. */
  if (IDAAdataMalloc(IDA_mem) == SUNFALSE)
  {
    free(IDAADJ_mem);
    IDAADJ_mem = NULL;
    IDAProcessError(IDA_mem, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGAM_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_MEM_FAIL);
  }

  /* Attach functions for the appropriate interpolation module */
  switch (interp)
  {
  case IDA_HERMITE:
    IDAADJ_mem->ia_malloc   = IDAAhermiteMalloc;
    IDAADJ_mem->ia_free     = IDAAhermiteFree;
    IDAADJ_mem->ia_getY     = IDAAhermiteGetY;
    IDAADJ_mem->ia_storePnt = IDAAhermiteStorePnt;
    break;

  case IDA_POLYNOMIAL:

    IDAADJ_mem->ia_malloc   = IDAApolynomialMalloc;
    IDAADJ_mem->ia_free     = IDAApolynomialFree;
    IDAADJ_mem->ia_getY     = IDAApolynomialGetY;
    IDAADJ_mem->ia_storePnt = IDAApolynomialStorePnt;
    break;
  }

  /* The interpolation module has not been initialized yet */
  IDAADJ_mem->ia_mallocDone = SUNFALSE;

  /* By default we will store but not interpolate sensitivities
   *  - storeSensi will be set in IDASolveF to SUNFALSE if FSA is not enabled
   *    or if the user forced this through IDAAdjSetNoSensi
   *  - interpSensi will be set in IDASolveB to SUNTRUE if storeSensi is SUNTRUE
   *    and if at least one backward problem requires sensitivities
   *  - noInterp will be set in IDACalcICB to SUNTRUE before the call to
   *    IDACalcIC and SUNFALSE after.*/

  IDAADJ_mem->ia_storeSensi  = SUNTRUE;
  IDAADJ_mem->ia_interpSensi = SUNFALSE;
  IDAADJ_mem->ia_noInterp    = SUNFALSE;

  /* Initialize backward problems. */
  IDAADJ_mem->IDAB_mem    = NULL;
  IDAADJ_mem->ia_bckpbCrt = NULL;
  IDAADJ_mem->ia_nbckpbs  = 0;

  /* IDASolveF and IDASolveB not called yet. */
  IDAADJ_mem->ia_firstIDAFcall = SUNTRUE;
  IDAADJ_mem->ia_tstopIDAFcall = SUNFALSE;

  IDAADJ_mem->ia_firstIDABcall = SUNTRUE;

  IDAADJ_mem->ia_rootret = SUNFALSE;

  /* Adjoint module initialized and allocated. */
  IDA_mem->ida_adj           = SUNTRUE;
  IDA_mem->ida_adjMallocDone = SUNTRUE;

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}